

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

void __thiscall
kernel::CCoinsStats::CCoinsStats(CCoinsStats *this,int block_height,uint256 *block_hash)

{
  long lVar1;
  _Storage<long,_true> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  optional<long> *in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_FS_OFFSET;
  uint256 *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_ESI;
  _Var2 = (in_RDX->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_payload;
  uVar3 = *(undefined8 *)
           &(in_RDX->super__Optional_base<long,_true,_true>)._M_payload.
            super__Optional_payload_base<long>._M_engaged;
  uVar4 = *(undefined8 *)
           &in_RDX[1].super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged;
  *(_Storage<long,_true> *)(in_RDI + 5) =
       in_RDX[1].super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  *(undefined8 *)(in_RDI + 7) = uVar4;
  *(_Storage<long,_true> *)(in_RDI + 1) = _Var2;
  *(undefined8 *)(in_RDI + 3) = uVar3;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  uint256::uint256(in_stack_ffffffffffffffc8);
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  std::optional<long>::optional<int,_true>(in_RDX,in_RDI);
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  *(undefined1 *)(in_RDI + 0x20) = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsStats::CCoinsStats(int block_height, const uint256& block_hash)
    : nHeight(block_height),
      hashBlock(block_hash) {}